

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ConfigureFinalPass(cmMakefile *this)

{
  bool bVar1;
  char *lhss;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  char *local_18;
  char *oldValue;
  cmMakefile *this_local;
  
  oldValue = (char *)this;
  FinalPass(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_BACKWARDS_COMPATIBILITY",&local_39);
  lhss = GetDefinition(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ((lhss != (char *)0x0) &&
     (local_18 = lhss, bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,"2.4"), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,
               "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less than 2.4. This version of CMake only supports backwards compatibility with CMake 2.4 or later. For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,&local_71);
    IssueMessage(this,FATAL_ERROR,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

void cmMakefile::ConfigureFinalPass()
{
  this->FinalPass();
  const char* oldValue
    = this->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY");
  if (oldValue && cmSystemTools::VersionCompare(
        cmSystemTools::OP_LESS, oldValue, "2.4"))
    {
    this->IssueMessage(
      cmake::FATAL_ERROR,
      "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less "
      "than 2.4. This version of CMake only supports backwards compatibility "
      "with CMake 2.4 or later. For compatibility with older versions please "
      "use any CMake 2.8.x release or lower.");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
  // Do old-style link dependency analysis only for CM_USE_OLD_VS6.
  if(this->GetGlobalGenerator()->IsForVS6())
    {
    for (cmTargets::iterator l = this->Targets.begin();
         l != this->Targets.end(); l++)
      {
      if (l->second.GetType() == cmState::INTERFACE_LIBRARY)
        {
        continue;
        }
      // Erase any cached link information that might have been comptued
      // on-demand during the configuration.  This ensures that build
      // system generation uses up-to-date information even if other cache
      // invalidation code in this source file is buggy.

      l->second.AnalyzeLibDependenciesForVS6(*this);
      }
    }
#endif
}